

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

void __thiscall
duckdb::DictionaryCompressionCompressState::AddLastLookup(DictionaryCompressionCompressState *this)

{
  atomic<unsigned_long> *paVar1;
  pointer pCVar2;
  
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&(this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             &this->latest_lookup_result);
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar2->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void DictionaryCompressionCompressState::AddLastLookup() {
	selection_buffer.push_back(latest_lookup_result);
	current_segment->count++;
}